

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange>
          (SmallVectorBase<slang::ConstantRange> *this,ConstantRange *args)

{
  size_type sVar1;
  ulong uVar2;
  ConstantRange *p;
  ConstantRange *pCVar3;
  ConstantRange *pCVar4;
  ConstantRange *pCVar5;
  long lVar6;
  ConstantRange *__src;
  ulong uVar7;
  long lVar8;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    *__src = *args;
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar7 = this->len + 1;
  uVar2 = this->cap;
  if (uVar7 < uVar2 * 2) {
    uVar7 = uVar2 * 2;
  }
  if (0xfffffffffffffff - uVar2 < uVar2) {
    uVar7 = 0xfffffffffffffff;
  }
  lVar8 = (long)__src - (long)this->data_;
  pCVar5 = (ConstantRange *)operator_new(uVar7 * 8);
  *(ConstantRange *)((long)pCVar5 + lVar8) = *args;
  p = this->data_;
  sVar1 = this->len;
  lVar6 = (long)p + (sVar1 * 8 - (long)__src);
  pCVar3 = p;
  pCVar4 = pCVar5;
  if (lVar6 == 0) {
    if (sVar1 != 0) {
      lVar6 = 0;
      do {
        *(undefined8 *)((long)&pCVar5->left + lVar6) = *(undefined8 *)((long)&p->left + lVar6);
        lVar6 = lVar6 + 8;
      } while (sVar1 << 3 != lVar6);
    }
  }
  else {
    for (; pCVar3 != __src; pCVar3 = pCVar3 + 1) {
      *pCVar4 = *pCVar3;
      pCVar4 = pCVar4 + 1;
    }
    memcpy((void *)((long)pCVar5 + lVar8 + 8),__src,(lVar6 - 8U & 0xfffffffffffffff8) + 8);
  }
  if (p != (ConstantRange *)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar7;
  this->data_ = pCVar5;
  return (reference)((long)pCVar5 + lVar8);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }